

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dogleg.c
# Opt level: O1

void dogleg(int n,double *r,int lr,double *diag,double *qtb,double delta,double *x,double *wa1,
           double *wa2)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  
  dVar15 = dpmpar(1);
  uVar1 = n + 1;
  uVar11 = (ulong)uVar1;
  if (0 < n) {
    iVar2 = (int)(uVar1 * n) / 2;
    iVar3 = iVar2 + 1;
    pdVar4 = x + (long)(int)uVar1 + -1;
    iVar5 = -2;
    uVar8 = 1;
    iVar9 = 0;
    do {
      lVar6 = (uint)n - uVar8;
      dVar20 = 0.0;
      if (lVar6 <= (long)((ulong)(uint)n - 2)) {
        lVar13 = 0;
        do {
          dVar20 = dVar20 + r[iVar2 + lVar13] * pdVar4[lVar13];
          lVar13 = lVar13 + 1;
        } while (iVar9 != (int)lVar13);
      }
      iVar3 = iVar3 - (int)uVar8;
      dVar22 = r[(long)iVar3 + -1];
      if ((dVar22 == 0.0) && (!NAN(dVar22))) {
        if (-1 < lVar6) {
          lVar13 = (ulong)uVar1 - 1;
          iVar12 = (int)lVar6 + 1;
          iVar10 = n + -1;
          do {
            uVar14 = -(ulong)(ABS(r[(long)iVar12 + -1]) <= dVar22);
            dVar22 = (double)(uVar14 & (ulong)dVar22 | ~uVar14 & (ulong)ABS(r[(long)iVar12 + -1]));
            iVar12 = iVar12 + iVar10;
            iVar10 = iVar10 + -1;
            lVar13 = lVar13 + -1;
          } while (lVar13 != 0);
        }
        dVar22 = dVar22 * dVar15;
        if ((dVar22 == 0.0) && (!NAN(dVar22))) {
          dVar22 = dVar15;
        }
      }
      x[lVar6] = (qtb[lVar6] - dVar20) / dVar22;
      uVar8 = uVar8 + 1;
      iVar2 = iVar2 + iVar5;
      iVar5 = iVar5 + -1;
      pdVar4 = pdVar4 + -1;
      iVar9 = iVar9 + 1;
      uVar1 = uVar1 - 1;
    } while (uVar8 != uVar11);
  }
  if (0 < n) {
    lVar6 = 0;
    do {
      wa1[lVar6] = 0.0;
      wa2[lVar6] = diag[lVar6] * x[lVar6];
      lVar6 = lVar6 + 1;
    } while (uVar11 - 1 != lVar6);
  }
  dVar15 = enorm(n,wa2);
  if (delta < dVar15) {
    if (0 < n) {
      uVar14 = 1;
      lVar6 = 1;
      pdVar4 = wa1;
      uVar8 = uVar11;
      do {
        uVar8 = uVar8 - 1;
        dVar20 = qtb[uVar14 - 1];
        uVar7 = 0;
        do {
          pdVar4[uVar7] = r[(long)(int)lVar6 + (uVar7 - 1)] * dVar20 + pdVar4[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
        wa1[uVar14 - 1] = wa1[uVar14 - 1] / diag[uVar14 - 1];
        uVar14 = uVar14 + 1;
        pdVar4 = pdVar4 + 1;
        lVar6 = (long)(int)lVar6 + uVar7;
      } while (uVar14 != uVar11);
    }
    dVar20 = enorm(n,wa1);
    dVar21 = delta / dVar15;
    dVar22 = 0.0;
    if ((dVar20 != 0.0) || (NAN(dVar20))) {
      if (0 < n) {
        lVar6 = 0;
        do {
          wa1[lVar6] = (wa1[lVar6] / dVar20) / diag[lVar6];
          lVar6 = lVar6 + 1;
        } while (uVar11 - 1 != lVar6);
      }
      if (0 < n) {
        uVar14 = 1;
        lVar6 = 1;
        pdVar4 = wa1;
        uVar8 = uVar11;
        do {
          uVar8 = uVar8 - 1;
          dVar22 = 0.0;
          uVar7 = 0;
          do {
            dVar22 = dVar22 + r[(long)(int)lVar6 + (uVar7 - 1)] * pdVar4[uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
          wa2[uVar14 - 1] = dVar22;
          uVar14 = uVar14 + 1;
          pdVar4 = pdVar4 + 1;
          lVar6 = (long)(int)lVar6 + uVar7;
        } while (uVar14 != uVar11);
      }
      dVar22 = enorm(n,wa2);
      dVar22 = (dVar20 / dVar22) / dVar22;
      if (delta <= dVar22) {
        dVar21 = 0.0;
      }
      else {
        dVar16 = enorm(n,qtb);
        auVar18._8_8_ = dVar16;
        auVar18._0_8_ = dVar22;
        auVar19._8_8_ = dVar20;
        auVar19._0_8_ = delta;
        auVar19 = divpd(auVar18,auVar19);
        dVar17 = auVar19._0_8_;
        dVar15 = auVar19._8_8_ * (dVar16 / dVar15) * dVar17;
        dVar20 = dVar15 - dVar21;
        dVar16 = 1.0 - dVar17 * dVar17;
        dVar20 = dVar20 * dVar20 + dVar16 * (1.0 - dVar21 * dVar21);
        if (dVar20 < 0.0) {
          dVar20 = sqrt(dVar20);
        }
        else {
          dVar20 = SQRT(dVar20);
        }
        dVar21 = (dVar21 * dVar16) / (dVar20 + -dVar21 * dVar17 * dVar17 + dVar15);
      }
    }
    if (0 < n) {
      lVar6 = 0;
      do {
        x[lVar6] = wa1[lVar6] *
                   (double)(~-(ulong)(dVar22 <= delta) & (ulong)delta |
                           (ulong)dVar22 & -(ulong)(dVar22 <= delta)) * (1.0 - dVar21) +
                   x[lVar6] * dVar21;
        lVar6 = lVar6 + 1;
      } while (uVar11 - 1 != lVar6);
    }
  }
  return;
}

Assistant:

__cminpack_attr__
void __cminpack_func__(dogleg)(int n, const real *r, int lr, 
	const real *diag, const real *qtb, real delta, real *x, 
	real *wa1, real *wa2)
{
    /* System generated locals */
    real d1, d2, d3, d4;

    /* Local variables */
    int i, j, k, l, jj, jp1;
    real sum, temp, alpha, bnorm;
    real gnorm, qnorm, epsmch;
    real sgnorm;

/*     ********** */

/*     subroutine dogleg */

/*     given an m by n matrix a, an n by n nonsingular diagonal */
/*     matrix d, an m-vector b, and a positive number delta, the */
/*     problem is to determine the convex combination x of the */
/*     gauss-newton and scaled gradient directions that minimizes */
/*     (a*x - b) in the least squares sense, subject to the */
/*     restriction that the euclidean norm of d*x be at most delta. */

/*     this subroutine completes the solution of the problem */
/*     if it is provided with the necessary information from the */
/*     qr factorization of a. that is, if a = q*r, where q has */
/*     orthogonal columns and r is an upper triangular matrix, */
/*     then dogleg expects the full upper triangle of r and */
/*     the first n components of (q transpose)*b. */

/*     the subroutine statement is */

/*       subroutine dogleg(n,r,lr,diag,qtb,delta,x,wa1,wa2) */

/*     where */

/*       n is a positive integer input variable set to the order of r. */

/*       r is an input array of length lr which must contain the upper */
/*         triangular matrix r stored by rows. */

/*       lr is a positive integer input variable not less than */
/*         (n*(n+1))/2. */

/*       diag is an input array of length n which must contain the */
/*         diagonal elements of the matrix d. */

/*       qtb is an input array of length n which must contain the first */
/*         n elements of the vector (q transpose)*b. */

/*       delta is a positive input variable which specifies an upper */
/*         bound on the euclidean norm of d*x. */

/*       x is an output array of length n which contains the desired */
/*         convex combination of the gauss-newton direction and the */
/*         scaled gradient direction. */

/*       wa1 and wa2 are work arrays of length n. */

/*     subprograms called */

/*       minpack-supplied ... dpmpar,enorm */

/*       fortran-supplied ... dabs,dmax1,dmin1,dsqrt */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
    /* Parameter adjustments */
    --wa2;
    --wa1;
    --x;
    --qtb;
    --diag;
    --r;
    (void)lr;

    /* Function Body */

/*     epsmch is the machine precision. */

    epsmch = __cminpack_func__(dpmpar)(1);

/*     first, calculate the gauss-newton direction. */

    jj = n * (n + 1) / 2 + 1;
    for (k = 1; k <= n; ++k) {
	j = n - k + 1;
	jp1 = j + 1;
	jj -= k;
	l = jj + 1;
	sum = 0.;
	if (n >= jp1) {
            for (i = jp1; i <= n; ++i) {
                sum += r[l] * x[i];
                ++l;
            }
        }
	temp = r[jj];
	if (temp == 0.) {
            l = j;
            for (i = 1; i <= j; ++i) {
                /* Computing MAX */
                d2 = fabs(r[l]);
                temp = max(temp,d2);
                l = l + n - i;
            }
            temp = epsmch * temp;
            if (temp == 0.) {
                temp = epsmch;
            }
        }
	x[j] = (qtb[j] - sum) / temp;
    }

/*     test whether the gauss-newton direction is acceptable. */

    for (j = 1; j <= n; ++j) {
	wa1[j] = 0.;
	wa2[j] = diag[j] * x[j];
    }
    qnorm = __cminpack_func__(enorm)(n, &wa2[1]);
    if (qnorm <= delta) {
        return;
    }

/*     the gauss-newton direction is not acceptable. */
/*     next, calculate the scaled gradient direction. */

    l = 1;
    for (j = 1; j <= n; ++j) {
	temp = qtb[j];
	for (i = j; i <= n; ++i) {
	    wa1[i] += r[l] * temp;
	    ++l;
	}
	wa1[j] /= diag[j];
    }

/*     calculate the norm of the scaled gradient and test for */
/*     the special case in which the scaled gradient is zero. */

    gnorm = __cminpack_func__(enorm)(n, &wa1[1]);
    sgnorm = 0.;
    alpha = delta / qnorm;
    if (gnorm != 0.) {

/*     calculate the point along the scaled gradient */
/*     at which the quadratic is minimized. */

        for (j = 1; j <= n; ++j) {
            wa1[j] = wa1[j] / gnorm / diag[j];
        }
        l = 1;
        for (j = 1; j <= n; ++j) {
            sum = 0.;
            for (i = j; i <= n; ++i) {
                sum += r[l] * wa1[i];
                ++l;
            }
            wa2[j] = sum;
        }
        temp = __cminpack_func__(enorm)(n, &wa2[1]);
        sgnorm = gnorm / temp / temp;

/*     test whether the scaled gradient direction is acceptable. */

        alpha = 0.;
        if (sgnorm < delta) {

/*     the scaled gradient direction is not acceptable. */
/*     finally, calculate the point along the dogleg */
/*     at which the quadratic is minimized. */

            bnorm = __cminpack_func__(enorm)(n, &qtb[1]);
            temp = bnorm / gnorm * (bnorm / qnorm) * (sgnorm / delta);
            /* Computing 2nd power */
            d1 = sgnorm / delta;
            /* Computing 2nd power */
            d2 = temp - delta / qnorm;
            /* Computing 2nd power */
            d3 = delta / qnorm;
            /* Computing 2nd power */
            d4 = sgnorm / delta;
            temp = temp - delta / qnorm * (d1 * d1)
                   + sqrt(d2 * d2
                          + (1 - d3 * d3) * (1 - d4 * d4));
            /* Computing 2nd power */
            d1 = sgnorm / delta;
            alpha = delta / qnorm * (1 - d1 * d1) / temp;
        }
    }

/*     form appropriate convex combination of the gauss-newton */
/*     direction and the scaled gradient direction. */

    temp = (1 - alpha) * min(sgnorm,delta);
    for (j = 1; j <= n; ++j) {
	x[j] = temp * wa1[j] + alpha * x[j];
    }

/*     last card of subroutine dogleg. */

}